

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O1

void crnlib::MatchFinder_Construct(CMatchFinder *p)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = 0;
  p->bufferBase = (Byte *)0x0;
  p->hash = (CLzRef *)0x0;
  p->cutValue = 0x20;
  p->btMode = 1;
  p->bigHash = 0;
  p->numHashBytes = 4;
  p->directInput = 0;
  do {
    iVar2 = 8;
    uVar4 = uVar1 & 0xffffffff;
    do {
      uVar3 = -((uint)uVar4 & 1) & 0xedb88320 ^ (uint)(uVar4 >> 1);
      uVar4 = (ulong)uVar3;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    p->crc[uVar1] = uVar3;
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x100);
  return;
}

Assistant:

void MatchFinder_Construct(CMatchFinder* p) {
  UInt32 i;
  p->bufferBase = 0;
  p->directInput = 0;
  p->hash = 0;
  MatchFinder_SetDefaultSettings(p);

  for (i = 0; i < 256; i++) {
    UInt32 r = i;
    int j;
    for (j = 0; j < 8; j++)
      r = (r >> 1) ^ (kCrcPoly & ~((r & 1) - 1));
    p->crc[i] = r;
  }
}